

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

uint32_t __thiscall Buffer::CopyOut(Buffer *this,char *out,uint32_t l)

{
  ushort uVar1;
  ushort uVar2;
  BufferChain *pBVar3;
  uint32_t uVar4;
  BufferChain *pBVar5;
  uint uVar6;
  
  pBVar5 = this->m_head;
  if (pBVar5 == (BufferChain *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar1 = pBVar5->write;
      uVar2 = pBVar5->read;
      if (uVar1 < uVar2) {
        __assert_fail("write >= read",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.cpp"
                      ,0x14,"uint16_t BufferChain::GetCanReadCount()");
      }
      if (uVar1 == uVar2) {
        pBVar3 = pBVar5->nextpkt;
        (*this->_vptr_Buffer[1])(this,pBVar5);
        this->m_head = pBVar3;
        pBVar5 = pBVar3;
        if (pBVar3 == (BufferChain *)0x0) {
          this->m_end = (BufferChain *)0x0;
          return uVar4;
        }
      }
      else {
        uVar6 = (uint)(ushort)(uVar1 - uVar2);
        if (l < uVar6) {
          if (uVar2 < 0xfec) {
            memcpy(out + uVar4,pBVar5->chain + uVar2,(ulong)l);
            return uVar4 + l;
          }
LAB_00104a9f:
          __assert_fail("read < _BUFFER_CHAIN_LEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.cpp"
                        ,8,"char *BufferChain::GetReadAddr()");
        }
        if (0xfeb < uVar2) goto LAB_00104a9f;
        memcpy(out + uVar4,pBVar5->chain + uVar2,(ulong)uVar6);
        uVar4 = uVar4 + uVar6;
        l = l - uVar6;
        if (l == 0) {
          return uVar4;
        }
        pBVar5 = pBVar5->nextpkt;
      }
    } while (pBVar5 != (BufferChain *)0x0);
  }
  return uVar4;
}

Assistant:

uint32_t Buffer::CopyOut(char* out, uint32_t l)
{
    uint32_t ret = 0;
    for(BufferChain* buff = m_head; buff != nullptr; )
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* tmp = buff->nextpkt;
            Cycle(buff);
            buff = tmp;
            m_head = buff;
            if(m_head == nullptr)
                m_end = nullptr;
        }
        else
        {
            if(l < canReadCount)
            {
                memcpy(out + ret, buff->GetReadAddr(), l);
                ret += l;
                return ret;
            }
            else
            {
                memcpy(out + ret, buff->GetReadAddr(), canReadCount);
                ret += canReadCount;
                l -= canReadCount;

                if(l == 0)
                    return ret;

                buff = buff->nextpkt;
            }
        }
    }
    return ret;
}